

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolynomialEvaluation.cpp
# Opt level: O1

PolyNf * __thiscall
Inferences::simplifyPoly<Kernel::NumTraits<Kernel::RationalConstantType>>
          (PolyNf *__return_storage_ptr__,Inferences *this,
          Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *in,PolyNf *simplifiedArgs,
          bool removeZeros)

{
  MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar1;
  mp_limb_t mVar2;
  mp_limb_t mVar3;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar4;
  ulong uVar5;
  PolyNf *pPVar6;
  bool bVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  IntegerConstantType *pIVar11;
  ulong uVar12;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> fac;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> simpl;
  Monom monom;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> local_1c8;
  uint local_19c;
  ulong local_198;
  PolyNf *local_190;
  long local_188;
  ulong local_180;
  Inferences *local_178;
  Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *local_170;
  __mpz_struct local_168;
  __mpz_struct local_158;
  uint local_148;
  MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *local_140;
  __mpz_struct local_138;
  __mpz_struct local_128;
  uint local_118;
  MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *local_110;
  RationalConstantType local_108;
  uint local_e8;
  MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *local_e0;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> local_d8;
  __mpz_struct local_a8;
  __mpz_struct local_98;
  int local_88;
  mp_limb_t *local_80;
  RationalConstantType local_78;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> local_58;
  
  local_1c8._cursor = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
  local_1c8._end = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
  local_1c8._capacity = 0;
  local_1c8._stack = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
  lVar8 = *(long *)(this + 8);
  local_19c = (uint)simplifiedArgs;
  uVar9 = local_19c & 0xff;
  local_190 = __return_storage_ptr__;
  local_178 = this;
  local_170 = in;
  if ((int)((ulong)(*(long *)(this + 0x10) - lVar8) >> 4) * -0x55555555 != 0) {
    uVar12 = 0;
    iVar10 = 0;
    do {
      pIVar11 = (IntegerConstantType *)(uVar12 * 0x30 + lVar8);
      Kernel::IntegerConstantType::IntegerConstantType((IntegerConstantType *)&local_a8,pIVar11);
      Kernel::IntegerConstantType::IntegerConstantType((IntegerConstantType *)&local_98,pIVar11 + 1)
      ;
      local_88 = pIVar11[2]._val[0]._mp_alloc;
      local_80 = pIVar11[2]._val[0]._mp_d;
      simplifyMonom<Kernel::NumTraits<Kernel::RationalConstantType>>
                (&local_d8,(Inferences *)&local_a8,
                 (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
                 (&(local_170->_summands)._capacity + (long)iVar10 * 3),(PolyNf *)(ulong)uVar9,
                 removeZeros);
      bVar7 = Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::isZeroMul(&local_d8);
      if (((byte)local_19c & bVar7) == 0) {
        pMVar1 = ((local_d8.factors._ptr)->_factors)._stack;
        if (((((int)((ulong)((long)((local_d8.factors._ptr)->_factors)._cursor - (long)pMVar1) >> 2)
               * -0x49249249 == 1) && (pMVar1->power == 1)) &&
            ((undefined1  [24])
             ((undefined1  [24])
              (pMVar1->term).super_PolyNfSuper._inner.
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
              .
              super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             & (undefined1  [24])0x3) == (undefined1  [24])0x2)) &&
           (((pMVar1->term).super_PolyNfSuper._inner.
             super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
             .
             super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             ._content[0] & 3U) == 1)) {
          local_188 = *(long *)((pMVar1->term).super_PolyNfSuper._inner.
                                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                .
                                super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                ._content + 9);
          pIVar11 = *(IntegerConstantType **)(local_188 + 8);
          lVar8 = (long)*(IntegerConstantType **)(local_188 + 0x10) - (long)pIVar11;
          if (pIVar11 != (IntegerConstantType *)0x0 && lVar8 != 0) {
            local_180 = (lVar8 >> 4) * -0x5555555555555555;
            local_198 = (ulong)(*(IntegerConstantType **)(local_188 + 0x10) != pIVar11);
            do {
              Kernel::IntegerConstantType::IntegerConstantType(&local_108._num,pIVar11);
              Kernel::IntegerConstantType::IntegerConstantType(&local_108._den,pIVar11 + 1);
              local_e8 = pIVar11[2]._val[0]._mp_alloc;
              local_e0 = (MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
                         pIVar11[2]._val[0]._mp_d;
              Kernel::RationalConstantType::operator*(&local_78,&local_108,&local_d8.numeral);
              mpz_swap((__mpz_struct *)&local_108,(__mpz_struct *)&local_78);
              mpz_swap(local_108._den._val,local_78._den._val);
              mpz_clear(local_78._den._val);
              mpz_clear((__mpz_struct *)&local_78);
              Kernel::IntegerConstantType::IntegerConstantType
                        ((IntegerConstantType *)&local_138,&local_108._num);
              Kernel::IntegerConstantType::IntegerConstantType
                        ((IntegerConstantType *)&local_128,&local_108._den);
              local_118 = local_e8;
              local_110 = local_e0;
              if (local_1c8._cursor == local_1c8._end) {
                ::Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::
                expand(&local_1c8);
              }
              pMVar4 = local_1c8._cursor;
              Kernel::IntegerConstantType::IntegerConstantType
                        ((IntegerConstantType *)local_1c8._cursor,(IntegerConstantType *)&local_138)
              ;
              Kernel::IntegerConstantType::IntegerConstantType
                        (&(pMVar4->numeral)._den,(IntegerConstantType *)&local_128);
              (pMVar4->factors)._id = local_118;
              (pMVar4->factors)._ptr = local_110;
              local_1c8._cursor = local_1c8._cursor + 1;
              mpz_clear(&local_128);
              mpz_clear(&local_138);
              uVar5 = local_198;
              mpz_clear(local_108._den._val);
              mpz_clear((__mpz_struct *)&local_108);
              if (uVar5 < local_180) {
                local_198 = uVar5 + 1;
                pIVar11 = (IntegerConstantType *)(uVar5 * 0x30 + *(long *)(local_188 + 8));
              }
              else {
                pIVar11 = (IntegerConstantType *)0x0;
              }
            } while (pIVar11 != (IntegerConstantType *)0x0);
          }
        }
        else {
          Kernel::IntegerConstantType::IntegerConstantType
                    ((IntegerConstantType *)&local_168,(IntegerConstantType *)&local_d8);
          Kernel::IntegerConstantType::IntegerConstantType
                    ((IntegerConstantType *)&local_158,&local_d8.numeral._den);
          local_148 = local_d8.factors._id;
          local_140 = local_d8.factors._ptr;
          if (local_1c8._cursor == local_1c8._end) {
            ::Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::expand
                      (&local_1c8);
          }
          pMVar4 = local_1c8._cursor;
          Kernel::IntegerConstantType::IntegerConstantType
                    ((IntegerConstantType *)local_1c8._cursor,(IntegerConstantType *)&local_168);
          Kernel::IntegerConstantType::IntegerConstantType
                    (&(pMVar4->numeral)._den,(IntegerConstantType *)&local_158);
          (pMVar4->factors)._id = local_148;
          (pMVar4->factors)._ptr = local_140;
          local_1c8._cursor = local_1c8._cursor + 1;
          mpz_clear(&local_158);
          mpz_clear(&local_168);
        }
      }
      mVar2 = local_80[2];
      mVar3 = local_80[1];
      mpz_clear(local_d8.numeral._den._val);
      mpz_clear((__mpz_struct *)&local_d8);
      mpz_clear(&local_98);
      mpz_clear(&local_a8);
      iVar10 = iVar10 + (int)(mVar2 - mVar3 >> 2) * -0x49249249;
      uVar12 = uVar12 + 1;
      lVar8 = *(long *)(local_178 + 8);
    } while (uVar12 < (uint)((int)((ulong)(*(long *)(local_178 + 0x10) - lVar8) >> 4) * -0x55555555)
            );
  }
  pPVar6 = local_190;
  local_58._cursor = local_1c8._cursor;
  local_58._capacity = local_1c8._capacity;
  local_1c8._capacity = 0;
  local_58._end = local_1c8._end;
  local_1c8._end = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
  local_1c8._cursor = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
  local_58._stack = local_1c8._stack;
  local_1c8._stack = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
  PolynomialEvaluation::simplifySummation<Kernel::NumTraits<Kernel::RationalConstantType>>
            (local_190,(PolynomialEvaluation *)&local_58,
             (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *)(ulong)uVar9
             ,false);
  ::Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::~Stack(&local_58);
  ::Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::~Stack(&local_1c8)
  ;
  return pPVar6;
}

Assistant:

PolyNf simplifyPoly(Polynom<Number> const& in, PolyNf* simplifiedArgs, bool removeZeros)
{
  using Monom   = Monom<Number>;


  // first we simplify all the monoms containted in this polynom
  Stack<Monom> sum;
  {
    auto offs = 0;
    for (unsigned i = 0; i < in.nSummands(); i++) {
      auto monom  = in.summandAt(i);
      auto simpl = simplifyMonom(monom, &simplifiedArgs[offs], removeZeros);

      if (simpl.isZeroMul() && removeZeros) {
        /* we don't add it */
      } else if (simpl.factors->nFactors() == 1 && simpl.factors->factorAt(0).tryPolynom().isSome()) {
        /* k * (t1 + ... tn) ==> k * t1 + ... k * tn */
        auto poly = simpl.factors->factorAt(0).tryPolynom().unwrap();
        for (auto fac : poly->iterSummands()) {
          fac.numeral = fac.numeral * simpl.numeral;
          ASS(!removeZeros || fac.numeral != Number::constant(0))
          sum.push(fac);
        }
      } else {
        sum.push(simpl);
      }
      offs += monom.factors->nFactors();
    }
  }

  return PolynomialEvaluation::simplifySummation(std::move(sum), removeZeros);
}